

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>::
runOnFunction(WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
              *this,Module *module,Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    (this->super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>).
    super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.currModule = module;
    (this->super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>).
    super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.currFunction = func;
    Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>::walk
              (&(this->super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>)
                .super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>,
               &func->body);
    (this->super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>).
    super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.currFunction =
         (Function *)0x0;
    (this->super_PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>).
    super_Walker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>.currModule =
         (Module *)0x0;
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                ,0x214,
                "virtual void wasm::WalkerPass<wasm::PostWalker<FunctionOptimizer>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<FunctionOptimizer>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }